

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsObjectiveFunction.cpp
# Opt level: O0

void __thiscall
HighsObjectiveFunction::setupCliquePartition
          (HighsObjectiveFunction *this,HighsDomain *globaldom,HighsCliqueTable *cliqueTable)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  bool bVar2;
  int iVar3;
  reference piVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  reference pvVar9;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  HighsCliqueTable *unaff_retaddr;
  HighsInt i_1;
  HighsInt j;
  HighsInt i;
  HighsInt k;
  HighsInt p;
  HighsInt numPartitions;
  HighsInt col;
  iterator it;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> binaryEnd;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clqvars;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *pvVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff28;
  value_type vVar11;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  int local_94;
  int local_70;
  int local_6c;
  value_type local_68;
  int local_64;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int *local_40;
  int *local_38;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_30;
  
  if (1 < *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 4)) {
    pvVar10 = in_RDI;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x6644e4);
    local_40 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
    local_38 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator+(in_stack_ffffffffffffff28,(difference_type)in_stack_ffffffffffffff20
                               );
    local_48._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff20,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff18), bVar2) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)
                 ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1),(long)*piVar4);
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      emplace_back<int&,bool>
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)in_stack_ffffffffffffff30.this,(int *)in_stack_ffffffffffffff28,
                 (bool *)in_stack_ffffffffffffff20);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_48);
    }
    HighsCliqueTable::cliquePartition(unaff_retaddr,pvVar10,in_RSI,in_RDX);
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 3));
    iVar3 = (int)sVar5 + -1;
    if (iVar3 == *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else {
      local_64 = 0;
      local_68 = 0;
      for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)(local_6c + 1));
        iVar1 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_6c);
        if (iVar1 - *pvVar6 != 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_64);
          *pvVar6 = local_68;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_6c);
          for (local_70 = *pvVar6;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),
                                  (long)(local_6c + 1)), local_70 < *pvVar6; local_70 = local_70 + 1
              ) {
            pvVar7 = std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::operator[](&local_30,(long)local_70);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),
                                (ulong)((uint)*pvVar7 & 0x7fffffff));
            *pvVar6 = local_68;
            local_68 = local_68 + 1;
          }
          local_64 = local_64 + 1;
        }
      }
      begin._M_current = (int *)(in_RDI + 3);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)begin._M_current,(long)local_64);
      *pvVar6 = local_68;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)begin._M_current,
                 CONCAT44(local_68,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff30.this = (HighsObjectiveFunction *)(in_RDI + 1);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_ffffffffffffff28,(difference_type)in_stack_ffffffffffffff20);
      end._M_current._4_4_ = local_68;
      end._M_current._0_4_ = in_stack_ffffffffffffff38;
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0>
                (begin,end,in_stack_ffffffffffffff30);
      for (local_94 = 0;
          local_94 <
          *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 4); local_94 = local_94 + 1) {
        pvVar10 = (vector<double,_std::allocator<double>_> *)
                  ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_94);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)*pvVar6);
        vVar11 = *pvVar8;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 2,(long)local_94)
        ;
        *pvVar9 = vVar11;
      }
    }
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::~vector
              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               in_stack_ffffffffffffff30.this);
  }
  return;
}

Assistant:

void HighsObjectiveFunction::setupCliquePartition(
    const HighsDomain& globaldom, HighsCliqueTable& cliqueTable) {
  // skip if not more than 1 binary column is present
  if (numBinary <= 1) return;

  std::vector<HighsCliqueTable::CliqueVar> clqvars;

  auto binaryEnd = objectiveNonzeros.begin() + numBinary;

  for (auto it = objectiveNonzeros.begin(); it != binaryEnd; ++it) {
    HighsInt col = *it;
    clqvars.emplace_back(col, model->col_cost_[col] < 0.0);
  }

  cliqueTable.cliquePartition(model->col_cost_, clqvars, cliquePartitionStart);
  HighsInt numPartitions = cliquePartitionStart.size() - 1;
  if (numPartitions == numBinary)
    cliquePartitionStart.resize(1);
  else {
    HighsInt p = 0;
    HighsInt k = 0;

    for (HighsInt i = 0; i < numPartitions; ++i) {
      if (cliquePartitionStart[i + 1] - cliquePartitionStart[i] == 1) continue;

      cliquePartitionStart[p] = k;

      for (HighsInt j = cliquePartitionStart[i];
           j < cliquePartitionStart[i + 1]; ++j) {
        colToPartition[clqvars[j].col] = k++;
      }

      ++p;
    }

    cliquePartitionStart[p] = k;
    cliquePartitionStart.resize(p + 1);

    pdqsort(objectiveNonzeros.begin(), objectiveNonzeros.begin() + numBinary,
            [&](HighsInt i, HighsInt j) {
              return std::make_pair((HighsUInt)colToPartition[i],
                                    HighsHashHelpers::hash(i)) <
                     std::make_pair((HighsUInt)colToPartition[j],
                                    HighsHashHelpers::hash(j));
            });

    for (HighsInt i = 0; i < numBinary; ++i)
      objectiveVals[i] = model->col_cost_[objectiveNonzeros[i]];
  }
}